

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<std::complex<double>_>::Subst_LForward
          (TPZMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *B)

{
  int64_t iVar1;
  long lVar2;
  long lVar3;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  undefined4 uVar4;
  undefined4 uVar5;
  int64_t i;
  complex<double> sum;
  int64_t c;
  int64_t r;
  char *in_stack_00000138;
  char *in_stack_00000140;
  complex<double> *in_stack_ffffffffffffff38;
  TPZBaseMatrix *in_stack_ffffffffffffff40;
  undefined1 local_78 [8];
  undefined8 local_70;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_40;
  long local_38;
  complex<double> local_30;
  long local_20;
  long local_18;
  TPZBaseMatrix *local_10;
  
  local_10 = in_RSI;
  iVar1 = TPZBaseMatrix::Rows(in_RSI);
  lVar2 = (**(code **)(*in_RDI + 0x60))();
  if (((iVar1 != lVar2) || ((char)in_RDI[3] == '\0')) || ((char)in_RDI[3] != '\x04')) {
    Error(in_stack_00000140,in_stack_00000138);
  }
  local_18 = 0;
  while( true ) {
    lVar2 = local_18;
    lVar3 = (**(code **)(*in_RDI + 0x60))();
    if (lVar3 <= lVar2) break;
    local_20 = 0;
    while( true ) {
      lVar2 = local_20;
      iVar1 = TPZBaseMatrix::Cols(local_10);
      if (iVar1 <= lVar2) break;
      uVar4 = 0;
      uVar5 = 0;
      std::complex<double>::complex(&local_30,0.0,0.0);
      for (local_38 = 0; lVar3 = local_18, lVar2 = local_20, local_38 < local_18;
          local_38 = local_38 + 1) {
        local_58 = (**(code **)(*in_RDI + 0x120))(in_RDI,local_18,local_38);
        local_50 = CONCAT44(uVar5,uVar4);
        (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_10,local_38,local_20);
        local_60 = CONCAT44(uVar5,uVar4);
        std::operator*(in_stack_ffffffffffffff38,(complex<double> *)0x12b9d6e);
        local_40 = CONCAT44(uVar5,uVar4);
        std::complex<double>::operator+=
                  ((complex<double> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      }
      in_stack_ffffffffffffff40 = local_10;
      (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_10,local_18,local_20);
      std::operator-(in_stack_ffffffffffffff38,(complex<double> *)0x12b9e14);
      local_70 = CONCAT44(uVar5,uVar4);
      (*(in_stack_ffffffffffffff40->super_TPZSavable)._vptr_TPZSavable[0x23])
                (in_stack_ffffffffffffff40,lVar3,lVar2,local_78);
      local_20 = local_20 + 1;
    }
    local_18 = local_18 + 1;
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_LForward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ELDLt) {
		Error("TPZMatrix::Subst_LForward incompatible dimensions\n");
	}
    for ( int64_t r = 0; r < Dim(); r++ ) {
        for ( int64_t c = 0; c < B->Cols();  c++ )    {
            // Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
            //
            TVar sum = 0.0;
            for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, B->GetVal(r, c) - sum );
        }
    }
    return( 1 );
}